

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O2

void packforblock24_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  ulong *puVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  uint64_t uVar32;
  int iVar33;
  
  puVar1 = *pin;
  uVar2 = puVar1[2];
  uVar3 = puVar1[3];
  uVar25 = puVar1[4];
  iVar33 = (int)base;
  uVar4 = puVar1[5];
  uVar5 = puVar1[6];
  uVar26 = puVar1[7];
  uVar6 = puVar1[8];
  uVar7 = puVar1[9];
  uVar8 = puVar1[10];
  uVar9 = puVar1[0xb];
  uVar27 = puVar1[0xc];
  uVar10 = puVar1[0xd];
  uVar11 = puVar1[0xe];
  uVar28 = puVar1[0xf];
  uVar12 = puVar1[0x10];
  uVar13 = puVar1[0x11];
  uVar14 = puVar1[0x12];
  uVar15 = puVar1[0x13];
  uVar29 = puVar1[0x14];
  uVar16 = puVar1[0x15];
  uVar17 = puVar1[0x16];
  uVar30 = puVar1[0x17];
  uVar18 = puVar1[0x18];
  uVar19 = puVar1[0x19];
  uVar20 = puVar1[0x1a];
  uVar21 = puVar1[0x1b];
  uVar31 = puVar1[0x1c];
  uVar22 = puVar1[0x1d];
  uVar23 = puVar1[0x1e];
  uVar32 = puVar1[0x1f];
  puVar24 = (ulong *)*pw;
  *puVar24 = uVar2 - base << 0x30 | (puVar1[1] - base) * 0x1000000 | *puVar1 - base;
  puVar24[1] = uVar4 - base << 0x38 | (ulong)(uint)((int)uVar25 - iVar33) << 0x20 |
               (uVar3 - base) * 0x100 | uVar2 - base >> 0x10;
  puVar24[2] = (ulong)(uint)((int)uVar26 - iVar33) << 0x28 |
               (uVar5 - base) * 0x10000 | uVar4 - base >> 8;
  puVar24[3] = uVar8 - base << 0x30 | (uVar7 - base) * 0x1000000 | uVar6 - base;
  puVar24[4] = uVar10 - base << 0x38 | (ulong)(uint)((int)uVar27 - iVar33) << 0x20 |
               (uVar9 - base) * 0x100 | uVar8 - base >> 0x10;
  puVar24[5] = (ulong)(uint)((int)uVar28 - iVar33) << 0x28 |
               (uVar11 - base) * 0x10000 | uVar10 - base >> 8;
  puVar24[6] = uVar14 - base << 0x30 | (uVar13 - base) * 0x1000000 | uVar12 - base;
  puVar24[7] = uVar16 - base << 0x38 | (ulong)(uint)((int)uVar29 - iVar33) << 0x20 |
               (uVar15 - base) * 0x100 | uVar14 - base >> 0x10;
  puVar24[8] = (ulong)(uint)((int)uVar30 - iVar33) << 0x28 |
               (uVar17 - base) * 0x10000 | uVar16 - base >> 8;
  puVar24[9] = uVar20 - base << 0x30 | (uVar19 - base) * 0x1000000 | uVar18 - base;
  puVar24[10] = uVar22 - base << 0x38 | (ulong)(uint)((int)uVar31 - iVar33) << 0x20 |
                (uVar21 - base) * 0x100 | uVar20 - base >> 0x10;
  puVar24[0xb] = (ulong)(uint)((int)uVar32 - iVar33) << 0x28 |
                 (uVar23 - base) * 0x10000 | uVar22 - base >> 8;
  *pin = puVar1 + 0x20;
  *pw = *pw + 0x60;
  return;
}

Assistant:

static void packforblock24_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  12 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  uint64_t w10;
  uint64_t w11;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 24;
  w0 |= (in[2] - base) << 48;
  w1 = (in[2] - base) >> 16;
  w1 |=  (in[3] - base) << 8;
  w1 |=  (in[4] - base) << 32;
  w1 |= (in[5] - base) << 56;
  w2 = (in[5] - base) >> 8;
  w2 |=  (in[6] - base) << 16;
  w2 |=  (in[7] - base) << 40;
  w3 = (in[8] - base);
  w3 |=  (in[9] - base) << 24;
  w3 |= (in[10] - base) << 48;
  w4 = (in[10] - base) >> 16;
  w4 |=  (in[11] - base) << 8;
  w4 |=  (in[12] - base) << 32;
  w4 |= (in[13] - base) << 56;
  w5 = (in[13] - base) >> 8;
  w5 |=  (in[14] - base) << 16;
  w5 |=  (in[15] - base) << 40;
  w6 = (in[16] - base);
  w6 |=  (in[17] - base) << 24;
  w6 |= (in[18] - base) << 48;
  w7 = (in[18] - base) >> 16;
  w7 |=  (in[19] - base) << 8;
  w7 |=  (in[20] - base) << 32;
  w7 |= (in[21] - base) << 56;
  w8 = (in[21] - base) >> 8;
  w8 |=  (in[22] - base) << 16;
  w8 |=  (in[23] - base) << 40;
  w9 = (in[24] - base);
  w9 |=  (in[25] - base) << 24;
  w9 |= (in[26] - base) << 48;
  w10 = (in[26] - base) >> 16;
  w10 |=  (in[27] - base) << 8;
  w10 |=  (in[28] - base) << 32;
  w10 |= (in[29] - base) << 56;
  w11 = (in[29] - base) >> 8;
  w11 |=  (in[30] - base) << 16;
  w11 |=  (in[31] - base) << 40;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  pw64[10] = w10;
  pw64[11] = w11;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 96; /* we used up 96 output bytes */ 
}